

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O3

void __thiscall sglr::GLContext::~GLContext(GLContext *this)

{
  _Rb_tree_header *p_Var1;
  ShaderProgram *this_00;
  CallLogWrapper *this_01;
  int iVar2;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  pointer ppSVar5;
  _Self __tmp;
  deUint32 fbo;
  _Rb_tree_color local_2c;
  long lVar3;
  
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__GLContext_0217dd58;
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  p_Var4 = (this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      local_2c = p_Var4[1]._M_color;
      (**(code **)(lVar3 + 0x440))(1,&local_2c);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      local_2c = p_Var4[1]._M_color;
      (**(code **)(lVar3 + 0x460))(1,&local_2c);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      local_2c = p_Var4[1]._M_color;
      (**(code **)(lVar3 + 0x480))(1,&local_2c);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      local_2c = p_Var4[1]._M_color;
      (**(code **)(lVar3 + 0x438))(1,&local_2c);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      local_2c = p_Var4[1]._M_color;
      (**(code **)(lVar3 + 0x490))(1,&local_2c);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  for (ppSVar5 = (this->m_programs).
                 super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar5 !=
      (this->m_programs).
      super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar5 = ppSVar5 + 1) {
    this_00 = *ppSVar5;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
    }
    operator_delete(this_00,0xd0);
  }
  (**(code **)(lVar3 + 0x1680))(0);
  this_01 = this->m_wrapper;
  if (this_01 != (CallLogWrapper *)0x0) {
    glu::CallLogWrapper::~CallLogWrapper(this_01);
  }
  operator_delete(this_01,0x18);
  ppSVar5 = (this->m_programs).
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar5 != (pointer)0x0) {
    operator_delete(ppSVar5,(long)(this->m_programs).
                                  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar5
                   );
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->m_allocatedVaos)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->m_allocatedBuffers)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->m_allocatedRbos)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->m_allocatedFbos)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->m_allocatedTextures)._M_t);
  return;
}

Assistant:

GLContext::~GLContext (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	// Clean up all still alive objects
	for (std::set<deUint32>::const_iterator i = m_allocatedFbos.begin();
		 i != m_allocatedFbos.end(); i++)
	{
		deUint32 fbo = *i;
		gl.deleteFramebuffers(1, &fbo);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedRbos.begin();
		 i != m_allocatedRbos.end(); i++)
	{
		deUint32 rbo = *i;
		gl.deleteRenderbuffers(1, &rbo);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedTextures.begin();
		 i != m_allocatedTextures.end(); i++)
	{
		deUint32 tex = *i;
		gl.deleteTextures(1, &tex);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedBuffers.begin();
		 i != m_allocatedBuffers.end(); i++)
	{
		deUint32 buf = *i;
		gl.deleteBuffers(1, &buf);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedVaos.begin();
		 i != m_allocatedVaos.end(); i++)
	{
		deUint32 vao = *i;
		gl.deleteVertexArrays(1, &vao);
	}

	for (std::vector<glu::ShaderProgram*>::iterator i = m_programs.begin();
		i != m_programs.end(); i++)
	{
		delete *i;
	}

	gl.useProgram(0);

	delete m_wrapper;
}